

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::
WalkSerialArenaChunk<google::protobuf::internal::ThreadSafeArena::CleanupList()::__0>
          (ThreadSafeArena *this)

{
  bool bVar1;
  SerialArenaChunk *pSVar2;
  SerialArenaChunk *next_chunk;
  SerialArenaChunk *chunk;
  ThreadSafeArena *this_local;
  SerialArenaChunk *local_10;
  
  next_chunk = std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::load
                         (&this->head_,memory_order_relaxed);
  while( true ) {
    bVar1 = SerialArenaChunk::IsSentry(next_chunk);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar2 = SerialArenaChunk::next_chunk(next_chunk);
    local_10 = pSVar2;
    CleanupList::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&this_local + 7),next_chunk);
    next_chunk = pSVar2;
  }
  return;
}

Assistant:

void ThreadSafeArena::WalkSerialArenaChunk(Callback fn) {
  // By omitting an Acquire barrier we help the sanitizer that any user code
  // that doesn't properly synchronize Reset() or the destructor will throw a
  // TSAN warning.
  SerialArenaChunk* chunk = head_.load(std::memory_order_relaxed);

  while (!chunk->IsSentry()) {
    // Cache next chunk in case this chunk is destroyed.
    SerialArenaChunk* next_chunk = chunk->next_chunk();
    // Prefetch the next chunk.
    absl::PrefetchToLocalCache(next_chunk);
    fn(chunk);
    chunk = next_chunk;
  }
}